

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

int nullcGetResultInt(void)

{
  int local_c;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_c = 0;
  }
  else if (NULLC::currExec == 1) {
    local_c = ExecutorX86::GetResultInt(NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    local_c = ExecutorRegVm::GetResultInt(NULLC::executorRegVm);
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int nullcGetResultInt()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultInt();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultInt();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultInt();
#endif

	return 0;
}